

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *callback,void *userData)

{
  uint uVar1;
  uint uVar2;
  PaStreamParameters *params;
  int iVar3;
  PaError PVar4;
  char *pcVar5;
  PaAlsaStream *self;
  pollfd *ppVar6;
  unsigned_long uVar7;
  PaUtilBufferProcessor *bp;
  PaStreamParameters *inParams;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  unsigned_long local_90;
  int local_80;
  PaUtilHostBufferSizeMode hostBufferSizeMode;
  PaStreamParameters *local_78;
  PaSampleFormat local_70;
  PaSampleFormat local_68;
  ulong local_60;
  PaStreamFlags local_58;
  PaStream **local_50;
  PaStreamParameters *local_48;
  PaTime outputLatency;
  PaTime inputLatency;
  
  hostBufferSizeMode = paUtilFixedHostBufferSize;
  if ((short)(streamFlags >> 0x10) != 0) {
    return -0x270b;
  }
  uVar8 = 0;
  if (inputParameters == (PaStreamParameters *)0x0) {
    local_68 = 0;
    local_80 = 0;
  }
  else {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (paUtilErr_ < 0) {
      pcVar5 = 
      "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2821\n"
      ;
      goto LAB_0010cb9a;
    }
    local_80 = inputParameters->channelCount;
    local_68 = inputParameters->sampleFormat;
  }
  local_58 = streamFlags;
  if (outputParameters == (PaStreamParameters *)0x0) {
    local_70 = 0;
  }
  else {
    paUtilErr_ = ValidateParameters(outputParameters,hostApi,StreamDirection_Out);
    if (paUtilErr_ < 0) {
      pcVar5 = 
      "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2828\n"
      ;
LAB_0010cb9a:
      PaUtil_DebugPrint(pcVar5);
      return paUtilErr_;
    }
    uVar8 = (ulong)(uint)outputParameters->channelCount;
    local_70 = outputParameters->sampleFormat;
  }
  local_90 = framesPerBuffer;
  if (framesPerBuffer == 0) {
    pcVar5 = getenv("PA_ALSA_PERIODSIZE");
    if (pcVar5 == (char *)0x0) {
      local_90 = 0;
    }
    else {
      iVar3 = atoi(pcVar5);
      local_90 = (unsigned_long)iVar3;
    }
  }
  local_50 = s;
  self = (PaAlsaStream *)PaUtil_AllocateMemory(0x388);
  if (self == (PaAlsaStream *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2841\n"
                     );
    return -0x2708;
  }
  local_78 = inputParameters;
  local_48 = outputParameters;
  memset(self,0,0x388);
  local_60 = uVar8;
  if (callback == (PaStreamCallback *)0x0) {
    PaUtil_InitializeStreamRepresentation
              ((PaUtilStreamRepresentation *)self,
               (PaUtilStreamInterface *)&hostApi[2].info.deviceCount,(PaStreamCallback *)0x0,
               userData);
  }
  else {
    PaUtil_InitializeStreamRepresentation
              ((PaUtilStreamRepresentation *)self,(PaUtilStreamInterface *)(hostApi + 1),callback,
               userData);
    self->callbackMode = 1;
  }
  self->framesPerUserBuffer = local_90;
  self->neverDropInput = (uint)local_58 & 4;
  memset(&self->capture,0,0x100);
  params = local_48;
  if ((local_78 == (PaStreamParameters *)0x0) ||
     (paUtilErr_ = PaAlsaStreamComponent_Initialize
                             (&self->capture,(PaAlsaHostApiRepresentation *)hostApi,local_78,
                              StreamDirection_In,(uint)(callback != (PaStreamCallback *)0x0)),
     -1 < paUtilErr_)) {
    if ((params != (PaStreamParameters *)0x0) &&
       (paUtilErr_ = PaAlsaStreamComponent_Initialize
                               (&self->playback,(PaAlsaHostApiRepresentation *)hostApi,params,
                                StreamDirection_Out,(uint)(callback != (PaStreamCallback *)0x0)),
       paUtilErr_ < 0)) {
      pcVar5 = 
      "Expression \'PaAlsaStreamComponent_Initialize( &self->playback, alsaApi, outParams, StreamDirection_Out, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2177\n"
      ;
      goto LAB_0010cbc0;
    }
    inParams = local_78;
    uVar1 = (self->capture).nfds;
    uVar2 = (self->playback).nfds;
    iVar3 = (int)local_60;
    if (uVar1 == 0 && uVar2 == 0) {
      __assert_fail("self->capture.nfds || self->playback.nfds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x884,
                    "PaError PaAlsaStream_Initialize(PaAlsaStream *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, PaStreamCallback *, PaStreamFlags, void *)"
                   );
    }
    ppVar6 = (pollfd *)PaUtil_AllocateMemory((ulong)(uVar2 + uVar1) << 3);
    self->pfds = ppVar6;
    if (ppVar6 != (pollfd *)0x0) {
      PaUtil_InitializeCpuLoadMeasurer(&self->cpuLoadMeasurer,sampleRate);
      PVar4 = PaUnixMutex_Initialize(&self->stateMtx);
      if (PVar4 != 0) {
        __assert_fail("paNoError == __pa_assert_error_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x88a,
                      "PaError PaAlsaStream_Initialize(PaAlsaStream *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, PaStreamCallback *, PaStreamFlags, void *)"
                     );
      }
      paUtilErr_ = 0;
      goto LAB_0010c9ac;
    }
    PaUtil_DebugPrint(
                     "Expression \'self->pfds = (struct pollfd*)PaUtil_AllocateMemory( ( self->capture.nfds + self->playback.nfds ) * sizeof( struct pollfd ) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2183\n"
                     );
    paUtilErr_ = -0x2708;
  }
  else {
    pcVar5 = 
    "Expression \'PaAlsaStreamComponent_Initialize( &self->capture, alsaApi, inParams, StreamDirection_In, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2173\n"
    ;
LAB_0010cbc0:
    PaUtil_DebugPrint(pcVar5);
    iVar3 = (int)local_60;
    inParams = local_78;
    if (-1 < paUtilErr_) {
LAB_0010c9ac:
      paUtilErr_ = PaAlsaStream_Configure
                             (self,inParams,params,sampleRate,local_90,&inputLatency,&outputLatency,
                              &hostBufferSizeMode);
      if (paUtilErr_ < 0) {
        pcVar5 = 
        "Expression \'PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer, &inputLatency, &outputLatency, &hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2846\n"
        ;
      }
      else {
        bp = &self->bufferProcessor;
        paUtilErr_ = PaUtil_InitializeBufferProcessor
                               (bp,local_80,local_68,
                                (ulong)((uint)((self->capture).hostInterleaved == 0) << 0x1f) |
                                (self->capture).hostSampleFormat,iVar3,local_70,
                                (ulong)((uint)((self->playback).hostInterleaved == 0) << 0x1f) |
                                (self->playback).hostSampleFormat,sampleRate,local_58,local_90,
                                self->maxFramesPerHostBuffer,hostBufferSizeMode,callback,userData);
        if (-1 < paUtilErr_) {
          if (0 < local_80) {
            uVar7 = PaUtil_GetBufferProcessorInputLatencyFrames(bp);
            auVar9._8_4_ = (int)(uVar7 >> 0x20);
            auVar9._0_8_ = uVar7;
            auVar9._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.inputLatency =
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) / sampleRate +
                 inputLatency;
          }
          if (0 < iVar3) {
            uVar7 = PaUtil_GetBufferProcessorOutputLatencyFrames(bp);
            auVar10._8_4_ = (int)(uVar7 >> 0x20);
            auVar10._0_8_ = uVar7;
            auVar10._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.outputLatency =
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) / sampleRate +
                 outputLatency;
          }
          *local_50 = self;
          return 0;
        }
        pcVar5 = 
        "Expression \'PaUtil_InitializeBufferProcessor( &stream->bufferProcessor, numInputChannels, inputSampleFormat, hostInputSampleFormat, numOutputChannels, outputSampleFormat, hostOutputSampleFormat, sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer, hostBufferSizeMode, callback, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2854\n"
        ;
      }
      goto LAB_0010cb72;
    }
  }
  pcVar5 = 
  "Expression \'PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate, framesPerBuffer, callback, streamFlags, userData )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2843\n"
  ;
LAB_0010cb72:
  PaUtil_DebugPrint(pcVar5);
  PVar4 = paUtilErr_;
  PaAlsaStream_Terminate(self);
  return PVar4;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback* callback,
                           void *userData )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaAlsaStream *stream = NULL;
    PaSampleFormat hostInputSampleFormat = 0, hostOutputSampleFormat = 0;
    PaSampleFormat inputSampleFormat = 0, outputSampleFormat = 0;
    int numInputChannels = 0, numOutputChannels = 0;
    PaTime inputLatency, outputLatency;
    /* Operate with fixed host buffer size by default, since other modes will invariably lead to block adaption */
    /* XXX: Use Bounded by default? Output tends to get stuttery with Fixed ... */
    PaUtilHostBufferSizeMode hostBufferSizeMode = paUtilFixedHostBufferSize;

    if( ( streamFlags & paPlatformSpecificFlags ) != 0 )
        return paInvalidFlag;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        numInputChannels = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }
    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        numOutputChannels = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    /* XXX: Why do we support this anyway? */
    if( framesPerBuffer == paFramesPerBufferUnspecified && getenv( "PA_ALSA_PERIODSIZE" ) != NULL )
    {
        PA_DEBUG(( "%s: Getting framesPerBuffer (Alsa period-size) from environment\n", __FUNCTION__ ));
        framesPerBuffer = atoi( getenv("PA_ALSA_PERIODSIZE") );
    }

    PA_UNLESS( stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) ), paInsufficientMemory );
    PA_ENSURE( PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate,
                framesPerBuffer, callback, streamFlags, userData ) );

    PA_ENSURE( PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer,
                &inputLatency, &outputLatency, &hostBufferSizeMode ) );
    hostInputSampleFormat = stream->capture.hostSampleFormat | (!stream->capture.hostInterleaved ? paNonInterleaved : 0);
    hostOutputSampleFormat = stream->playback.hostSampleFormat | (!stream->playback.hostInterleaved ? paNonInterleaved : 0);

    PA_ENSURE( PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
                    numInputChannels, inputSampleFormat, hostInputSampleFormat,
                    numOutputChannels, outputSampleFormat, hostOutputSampleFormat,
                    sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer,
                    hostBufferSizeMode, callback, userData ) );

    /* Ok, buffer processor is initialized, now we can deduce it's latency */
    if( numInputChannels > 0 )
        stream->streamRepresentation.streamInfo.inputLatency = inputLatency + (PaTime)(
                PaUtil_GetBufferProcessorInputLatencyFrames( &stream->bufferProcessor ) / sampleRate);
    if( numOutputChannels > 0 )
        stream->streamRepresentation.streamInfo.outputLatency = outputLatency + (PaTime)(
                PaUtil_GetBufferProcessorOutputLatencyFrames( &stream->bufferProcessor ) / sampleRate);

    PA_DEBUG(( "%s: Stream: framesPerBuffer = %lu, maxFramesPerHostBuffer = %lu, latency i=%f, o=%f\n", __FUNCTION__, framesPerBuffer, stream->maxFramesPerHostBuffer, stream->streamRepresentation.streamInfo.inputLatency, stream->streamRepresentation.streamInfo.outputLatency));

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
    {
        PA_DEBUG(( "%s: Stream in error, terminating\n", __FUNCTION__ ));
        PaAlsaStream_Terminate( stream );
    }

    return result;
}